

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_FSA_dns_Switch.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *udata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  sunrealtype yd3;
  sunrealtype yd1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  void *udata_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 8);
  dVar1 = *(double *)((long)udata + 0x20);
  dVar2 = -*(double *)((long)udata + 0x10) * **(double **)((long)y->content + 0x10) +
          *(double *)((long)udata + 0x18) * dVar3 *
          *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(double **)((long)ydot->content + 0x10) = dVar2;
  dVar3 = dVar1 * dVar3 * dVar3;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 0x10) = dVar3;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 8) = -dVar2 - dVar3;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* udata)
{
  sunrealtype y1, y2, y3, yd1, yd3;
  UserData data;
  sunrealtype p1, p2, p3;

  y1   = NV_Ith_S(y, 0);
  y2   = NV_Ith_S(y, 1);
  y3   = NV_Ith_S(y, 2);
  data = (UserData)udata;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  yd1 = NV_Ith_S(ydot, 0) = -p1 * y1 + p2 * y2 * y3;
  yd3 = NV_Ith_S(ydot, 2) = p3 * y2 * y2;
  NV_Ith_S(ydot, 1)       = -yd1 - yd3;

  return (0);
}